

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int quicly_encode_transport_parameter_list
              (ptls_buffer_t *buf,quicly_transport_parameters_t *params,quicly_cid_t *original_dcid,
              quicly_cid_t *initial_scid,quicly_cid_t *retry_scid,void *stateless_reset_token,
              size_t expand_by)

{
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  uint8_t *puVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  uint8_t *puVar8;
  byte *pbVar9;
  uint8_t *puVar10;
  byte *local_38;
  
  iVar3 = ptls_buffer_reserve(buf,8);
  if (iVar3 == 0) {
    puVar4 = buf->base;
    sVar1 = buf->off;
    puVar4[sVar1] = '\x03';
    buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
    iVar3 = ptls_buffer__do_pushv(buf,"",1);
    if (iVar3 == 0) {
      sVar1 = buf->off;
      iVar3 = ptls_buffer_reserve(buf,8);
      if (iVar3 == 0) {
        pbVar9 = buf->base + buf->off;
        uVar2 = params->max_udp_payload_size;
        if (0x3f < uVar2) {
          if (uVar2 < 0x4000) {
            *pbVar9 = (byte)(uVar2 >> 8) | 0x40;
            pbVar9 = pbVar9 + 1;
          }
          else {
            quicly_encode_transport_parameter_list_cold_1();
            pbVar9 = local_38;
          }
        }
        *pbVar9 = (byte)uVar2;
        buf->off = (size_t)(pbVar9 + (1 - (long)buf->base));
        iVar3 = ptls_buffer__adjust_quic_blocksize
                          (buf,(long)(pbVar9 + (1 - (long)buf->base)) - sVar1);
        if (iVar3 == 0) {
          if ((params->max_stream_data).bidi_local != 0) {
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\x05';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 != 0) {
              return iVar3;
            }
            sVar1 = buf->off;
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = ptls_encode_quicint(buf->base + buf->off,(params->max_stream_data).bidi_local);
            sVar5 = (long)puVar4 - (long)buf->base;
            buf->off = sVar5;
            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,sVar5 - sVar1);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          if ((params->max_stream_data).bidi_remote != 0) {
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\x06';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 != 0) {
              return iVar3;
            }
            sVar1 = buf->off;
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = ptls_encode_quicint(buf->base + buf->off,(params->max_stream_data).bidi_remote)
            ;
            sVar5 = (long)puVar4 - (long)buf->base;
            buf->off = sVar5;
            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,sVar5 - sVar1);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          if ((params->max_stream_data).uni != 0) {
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\a';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 != 0) {
              return iVar3;
            }
            sVar1 = buf->off;
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = ptls_encode_quicint(buf->base + buf->off,(params->max_stream_data).uni);
            sVar5 = (long)puVar4 - (long)buf->base;
            buf->off = sVar5;
            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,sVar5 - sVar1);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          if (params->max_data != 0) {
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\x04';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 != 0) {
              return iVar3;
            }
            sVar1 = buf->off;
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = ptls_encode_quicint(buf->base + buf->off,params->max_data);
            sVar5 = (long)puVar4 - (long)buf->base;
            buf->off = sVar5;
            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,sVar5 - sVar1);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          if (params->max_idle_timeout != 0) {
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\x01';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 != 0) {
              return iVar3;
            }
            sVar1 = buf->off;
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = ptls_encode_quicint(buf->base + buf->off,params->max_idle_timeout);
            sVar5 = (long)puVar4 - (long)buf->base;
            buf->off = sVar5;
            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,sVar5 - sVar1);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          if (original_dcid != (quicly_cid_t *)0x0) {
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\0';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 != 0) {
              return iVar3;
            }
            sVar1 = buf->off;
            iVar3 = ptls_buffer__do_pushv(buf,original_dcid,(ulong)original_dcid->len);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,buf->off - sVar1);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          if (initial_scid != (quicly_cid_t *)0x0) {
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\x0f';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 != 0) {
              return iVar3;
            }
            sVar1 = buf->off;
            iVar3 = ptls_buffer__do_pushv(buf,initial_scid,(ulong)initial_scid->len);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,buf->off - sVar1);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          if (retry_scid != (quicly_cid_t *)0x0) {
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\x10';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 != 0) {
              return iVar3;
            }
            sVar1 = buf->off;
            iVar3 = ptls_buffer__do_pushv(buf,retry_scid,(ulong)retry_scid->len);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,buf->off - sVar1);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          if (stateless_reset_token != (void *)0x0) {
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\x02';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 != 0) {
              return iVar3;
            }
            sVar1 = buf->off;
            iVar3 = ptls_buffer__do_pushv(buf,stateless_reset_token,0x10);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,buf->off - sVar1);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          if (params->max_streams_bidi != 0) {
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\b';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 != 0) {
              return iVar3;
            }
            sVar1 = buf->off;
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = ptls_encode_quicint(buf->base + buf->off,params->max_streams_bidi);
            sVar5 = (long)puVar4 - (long)buf->base;
            buf->off = sVar5;
            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,sVar5 - sVar1);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          if (params->max_streams_uni != 0) {
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\t';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 != 0) {
              return iVar3;
            }
            sVar1 = buf->off;
            iVar3 = ptls_buffer_reserve(buf,8);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = ptls_encode_quicint(buf->base + buf->off,params->max_streams_uni);
            sVar5 = (long)puVar4 - (long)buf->base;
            buf->off = sVar5;
            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,sVar5 - sVar1);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          iVar3 = ptls_buffer_reserve(buf,8);
          if (iVar3 == 0) {
            puVar4 = buf->base;
            sVar1 = buf->off;
            puVar4[sVar1] = '\n';
            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
            iVar3 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar3 == 0) {
              sVar1 = buf->off;
              iVar3 = ptls_buffer_reserve(buf,8);
              if (iVar3 == 0) {
                puVar4 = buf->base;
                sVar5 = buf->off;
                puVar4[sVar5] = '\n';
                puVar4 = puVar4 + (sVar5 - (long)buf->base) + 1;
                buf->off = (size_t)puVar4;
                iVar3 = ptls_buffer__adjust_quic_blocksize(buf,(long)puVar4 - sVar1);
                if (iVar3 == 0) {
                  if (params->min_ack_delay_usec != 0xffffffffffffffff) {
                    iVar3 = ptls_buffer_reserve(buf,8);
                    if (iVar3 != 0) {
                      return iVar3;
                    }
                    puVar10 = buf->base;
                    sVar1 = buf->off;
                    puVar4 = puVar10 + sVar1;
                    puVar8 = puVar4 + 1;
                    *puVar4 = 0xc0;
                    lVar6 = -2 - (long)(puVar10 + sVar1);
                    lVar7 = 0x30;
                    do {
                      *puVar8 = (uint8_t)(0xff02de1aL >> ((byte)lVar7 & 0x3f));
                      puVar8 = puVar8 + 1;
                      lVar6 = lVar6 + -1;
                      lVar7 = lVar7 + -8;
                    } while (lVar7 != 0);
                    *puVar8 = '\x1a';
                    buf->off = -(long)(buf->base + lVar6);
                    iVar3 = ptls_buffer__do_pushv(buf,"",1);
                    if (iVar3 != 0) {
                      return iVar3;
                    }
                    sVar1 = buf->off;
                    iVar3 = ptls_buffer_reserve(buf,8);
                    if (iVar3 != 0) {
                      return iVar3;
                    }
                    puVar10 = buf->base;
                    sVar5 = buf->off;
                    puVar4 = puVar10 + sVar5;
                    puVar4[0] = 0x80;
                    puVar4[1] = '\0';
                    puVar4[2] = 'a';
                    puVar4[3] = 0xa8;
                    puVar10 = puVar10 + (sVar5 - (long)buf->base) + 4;
                    buf->off = (size_t)puVar10;
                    iVar3 = ptls_buffer__adjust_quic_blocksize(buf,(long)puVar10 - sVar1);
                    if (iVar3 != 0) {
                      return iVar3;
                    }
                  }
                  if ((params->field_0x50 & 1) != 0) {
                    iVar3 = ptls_buffer_reserve(buf,8);
                    if (iVar3 != 0) {
                      return iVar3;
                    }
                    puVar4 = buf->base;
                    sVar1 = buf->off;
                    puVar4[sVar1] = '\f';
                    buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
                    iVar3 = ptls_buffer__do_pushv(buf,"",1);
                    if (iVar3 != 0) {
                      return iVar3;
                    }
                    iVar3 = ptls_buffer__adjust_quic_blocksize(buf,0);
                    if (iVar3 != 0) {
                      return iVar3;
                    }
                  }
                  iVar3 = ptls_buffer_reserve(buf,8);
                  if (iVar3 == 0) {
                    puVar4 = buf->base;
                    sVar1 = buf->off;
                    puVar4[sVar1] = '\x0e';
                    buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
                    iVar3 = ptls_buffer__do_pushv(buf,"",1);
                    if (iVar3 == 0) {
                      sVar1 = buf->off;
                      iVar3 = ptls_buffer_reserve(buf,8);
                      if (iVar3 == 0) {
                        puVar4 = buf->base;
                        sVar5 = buf->off;
                        puVar4[sVar5] = '\x04';
                        puVar4 = puVar4 + (sVar5 - (long)buf->base) + 1;
                        buf->off = (size_t)puVar4;
                        iVar3 = ptls_buffer__adjust_quic_blocksize(buf,(long)puVar4 - sVar1);
                        if (iVar3 == 0) {
                          if (params->max_datagram_frame_size != 0) {
                            iVar3 = ptls_buffer_reserve(buf,8);
                            if (iVar3 != 0) {
                              return iVar3;
                            }
                            puVar4 = buf->base;
                            sVar1 = buf->off;
                            puVar4[sVar1] = ' ';
                            buf->off = (size_t)(puVar4 + (sVar1 - (long)buf->base) + 1);
                            iVar3 = ptls_buffer__do_pushv(buf,"",1);
                            if (iVar3 != 0) {
                              return iVar3;
                            }
                            sVar1 = buf->off;
                            iVar3 = ptls_buffer_reserve(buf,8);
                            if (iVar3 != 0) {
                              return iVar3;
                            }
                            puVar4 = ptls_encode_quicint(buf->base + buf->off,
                                                         (ulong)params->max_datagram_frame_size);
                            sVar5 = (long)puVar4 - (long)buf->base;
                            buf->off = sVar5;
                            iVar3 = ptls_buffer__adjust_quic_blocksize(buf,sVar5 - sVar1);
                            if (iVar3 != 0) {
                              return iVar3;
                            }
                          }
                          if (expand_by == 0) {
                            iVar3 = 0;
                          }
                          else {
                            iVar3 = ptls_buffer_reserve(buf,8);
                            if (iVar3 == 0) {
                              puVar10 = buf->base;
                              sVar1 = buf->off;
                              puVar4 = puVar10 + sVar1;
                              puVar4[0] = 'L';
                              puVar4[1] = '7';
                              buf->off = (size_t)(puVar10 + (sVar1 - (long)buf->base) + 2);
                              iVar3 = ptls_buffer__do_pushv(buf,"",1);
                              if (iVar3 == 0) {
                                sVar1 = buf->off;
                                iVar3 = ptls_buffer_reserve(buf,expand_by);
                                if (iVar3 == 0) {
                                  memset(buf->base + buf->off,0,expand_by);
                                  sVar5 = expand_by + buf->off;
                                  buf->off = sVar5;
                                  iVar3 = ptls_buffer__adjust_quic_blocksize(buf,sVar5 - sVar1);
                                  return iVar3;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int quicly_encode_transport_parameter_list(ptls_buffer_t *buf, const quicly_transport_parameters_t *params,
                                           const quicly_cid_t *original_dcid, const quicly_cid_t *initial_scid,
                                           const quicly_cid_t *retry_scid, const void *stateless_reset_token, size_t expand_by)
{
    int ret;

#define PUSH_TP(buf, id, block)                                                                                                    \
    do {                                                                                                                           \
        ptls_buffer_push_quicint((buf), (id));                                                                                     \
        ptls_buffer_push_block((buf), -1, block);                                                                                  \
    } while (0)

    PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_MAX_UDP_PAYLOAD_SIZE,
            { ptls_buffer_push_quicint(buf, params->max_udp_payload_size); });
    if (params->max_stream_data.bidi_local != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_LOCAL,
                { ptls_buffer_push_quicint(buf, params->max_stream_data.bidi_local); });
    if (params->max_stream_data.bidi_remote != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_REMOTE,
                { ptls_buffer_push_quicint(buf, params->max_stream_data.bidi_remote); });
    if (params->max_stream_data.uni != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_UNI,
                { ptls_buffer_push_quicint(buf, params->max_stream_data.uni); });
    if (params->max_data != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_DATA, { ptls_buffer_push_quicint(buf, params->max_data); });
    if (params->max_idle_timeout != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_MAX_IDLE_TIMEOUT, { ptls_buffer_push_quicint(buf, params->max_idle_timeout); });
    if (original_dcid != NULL)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_ORIGINAL_CONNECTION_ID,
                { ptls_buffer_pushv(buf, original_dcid->cid, original_dcid->len); });
    if (initial_scid != NULL)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_SOURCE_CONNECTION_ID,
                { ptls_buffer_pushv(buf, initial_scid->cid, initial_scid->len); });
    if (retry_scid != NULL)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_RETRY_SOURCE_CONNECTION_ID,
                { ptls_buffer_pushv(buf, retry_scid->cid, retry_scid->len); });
    if (stateless_reset_token != NULL)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_STATELESS_RESET_TOKEN,
                { ptls_buffer_pushv(buf, stateless_reset_token, QUICLY_STATELESS_RESET_TOKEN_LEN); });
    if (params->max_streams_bidi != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_BIDI,
                { ptls_buffer_push_quicint(buf, params->max_streams_bidi); });
    if (params->max_streams_uni != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_UNI,
                { ptls_buffer_push_quicint(buf, params->max_streams_uni); });
    if (QUICLY_LOCAL_ACK_DELAY_EXPONENT != QUICLY_DEFAULT_ACK_DELAY_EXPONENT)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_ACK_DELAY_EXPONENT,
                { ptls_buffer_push_quicint(buf, QUICLY_LOCAL_ACK_DELAY_EXPONENT); });
    if (QUICLY_LOCAL_MAX_ACK_DELAY != QUICLY_DEFAULT_MAX_ACK_DELAY)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_MAX_ACK_DELAY, { ptls_buffer_push_quicint(buf, QUICLY_LOCAL_MAX_ACK_DELAY); });
    if (params->min_ack_delay_usec != UINT64_MAX) {
        /* TODO consider the value we should advertise. */
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_MIN_ACK_DELAY,
                { ptls_buffer_push_quicint(buf, QUICLY_LOCAL_MAX_ACK_DELAY * 1000 /* in microseconds */); });
    }
    if (params->disable_active_migration)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_DISABLE_ACTIVE_MIGRATION, {});
    if (QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT != QUICLY_DEFAULT_ACTIVE_CONNECTION_ID_LIMIT)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_ACTIVE_CONNECTION_ID_LIMIT,
                { ptls_buffer_push_quicint(buf, QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT); });
    if (params->max_datagram_frame_size != 0)
        PUSH_TP(buf, QUICLY_TRANSPORT_PARAMETER_ID_MAX_DATAGRAM_FRAME_SIZE,
                { ptls_buffer_push_quicint(buf, params->max_datagram_frame_size); });
    /* if requested, add a greasing TP of 1 MTU size so that CH spans across multiple packets */
    if (expand_by != 0) {
        PUSH_TP(buf, 31 * 100 + 27, {
            if ((ret = ptls_buffer_reserve(buf, expand_by)) != 0)
                goto Exit;
            memset(buf->base + buf->off, 0, expand_by);
            buf->off += expand_by;
        });
    }

#undef PUSH_TP

    ret = 0;
Exit:
    return ret;
}